

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_group.c
# Opt level: O1

char * unshield_file_group_name(Unshield *unshield,int index)

{
  if ((-1 < index) && (index < unshield->header_list->file_group_count)) {
    return unshield->header_list->file_groups[(uint)index]->name;
  }
  return (char *)0x0;
}

Assistant:

const char* unshield_file_group_name(Unshield* unshield, int index)/*{{{*/
{
  Header* header = unshield->header_list;

  if (index >= 0 && index < header->file_group_count)
    return header->file_groups[index]->name;
  else
    return NULL;
}